

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzload.c
# Opt level: O2

int_fast64_t leapcorr(state *sp,time_t t)

{
  int_fast64_t *piVar1;
  long *plVar2;
  int iVar3;
  int_fast64_t *piVar4;
  
  iVar3 = sp->leapcnt + 1;
  piVar4 = &sp->lsis[(uint)sp->leapcnt].corr;
  do {
    iVar3 = iVar3 + -1;
    if (iVar3 < 1) {
      return 0;
    }
    piVar1 = piVar4 + -2;
    plVar2 = piVar4 + -3;
    piVar4 = piVar1;
  } while (t < *plVar2);
  return *piVar1;
}

Assistant:

static int_fast64_t leapcorr( struct state const * sp, time_t t )
{
    struct lsinfo const * lp;
    int i;

    i = sp->leapcnt;

    while ( --i >= 0 )
    {
        lp = &sp->lsis[ i ];

        if ( t >= lp->trans )
        {
            return lp->corr;
        }
    }

    return 0;
}